

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.cpp
# Opt level: O1

int GetNumAlphaCharsInString(string *my_str)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  
  sVar1 = my_str->_M_string_length;
  if (sVar1 == 0) {
    iVar4 = 0;
  }
  else {
    pcVar2 = (my_str->_M_dataplus)._M_p;
    sVar5 = 0;
    iVar4 = 0;
    do {
      iVar3 = isalpha((int)pcVar2[sVar5]);
      iVar4 = (iVar4 + 1) - (uint)(iVar3 == 0);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return iVar4;
}

Assistant:

int GetNumAlphaCharsInString(string *my_str)
{
    //Use is alpha function to find alpha chars.
    int alphaCount = 0;

    for(int i = 0; i < my_str->length(); i++)
    {

        if(isalpha(my_str->at(i)))
        {
            alphaCount++;
        }
    }

    return alphaCount;
}